

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O0

void __thiscall
Diligent::DeviceContextVkImpl::Flush
          (DeviceContextVkImpl *this,Uint32 NumCommandLists,ICommandList **ppCommandLists)

{
  pointer *this_00;
  QueryManagerVk *this_01;
  undefined *puVar1;
  VkSemaphore this_02;
  FenceVkImpl *Args_2;
  bool bVar2;
  bool bVar3;
  SoftwareQueueIndex SVar4;
  Uint32 UVar5;
  Char *pCVar6;
  RenderPassVkImpl *pRVar7;
  RenderDeviceVkImpl *pRVar8;
  VulkanLogicalDevice *LogicalDevice;
  CommandListVkImpl *this_03;
  DeviceContextDesc *pDVar9;
  reference pvVar10;
  reference ppVVar11;
  RefCntAutoPtr *this_04;
  IDeviceContext *pIVar12;
  char (*pacVar13) [94];
  size_type sVar14;
  size_type sVar15;
  char (*pacVar16) [64];
  char (*Args_1) [64];
  reference ppVVar17;
  FenceDesc *Args;
  char (*Args_4) [50];
  undefined8 uVar18;
  char (*pacVar19) [56];
  char (*Args_1_00) [56];
  char (*pacVar20) [58];
  char (*Args_1_01) [58];
  char (*pacVar21) [62];
  char (*Args_1_02) [62];
  Uint64 FenceValue;
  ResourceReleaseQueue<Diligent::DynamicStaleResourceWrapper> *this_05;
  reference this_06;
  DeviceContextVkImpl *this_07;
  char (*Args_1_03) [30];
  char (*in_RCX) [14];
  char (*Args_1_04) [31];
  ResourceReleaseQueue<Diligent::DynamicStaleResourceWrapper> *Args_1_05;
  char (*in_R8) [94];
  char (*in_stack_fffffffffffff3e8) [2];
  char (*in_stack_fffffffffffff3f8) [2];
  ResourceBindInfo *local_bc8;
  unsigned_long *local_b68;
  unsigned_long *local_b60;
  VkSemaphore_T **local_b58;
  VkSemaphore *local_b50;
  VkSemaphore_T **local_b48;
  array<Diligent::DeviceContextVkImpl::ResourceBindInfo,_3UL> local_a10;
  undefined1 auStack_440 [16];
  undefined1 local_430 [8];
  string msg_15;
  DeviceContextVkImpl *pDeferredCtxVkImpl;
  Uint32 i_2;
  string msg_14;
  size_t buff_idx;
  RecycledSyncObject<VulkanUtilities::VkSemaphoreType> *Sem;
  iterator __end2;
  iterator __begin2;
  vector<VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject<VulkanUtilities::VkSemaphoreType>,_std::allocator<VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject<VulkanUtilities::VkSemaphoreType>_>_>
  *__range2;
  ResourceReleaseQueue<Diligent::DynamicStaleResourceWrapper> *ReleaseQueue;
  Uint64 SubmittedFenceValue;
  VkTimelineSemaphoreSubmitInfo TimelineSemaphoreSubmitInfo;
  VkSubmitInfo SubmitInfo;
  string msg_13;
  string msg_12;
  string msg_11;
  value_type_conflict local_2ac;
  NativeType local_2a8;
  uchar local_299;
  undefined1 local_298 [8];
  VulkanRecycledSemaphore WaitSem_1;
  undefined1 local_270 [8];
  string _msg;
  size_t i_1;
  VkSemaphore WaitSem;
  FenceVkImpl *pFenceVk_1;
  pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_> *val_fence_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>,_std::allocator<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>_>_>
  *__range1_1;
  FenceVkImpl *local_210;
  FenceVkImpl *pFenceVk;
  pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_> *val_fence;
  iterator __end1;
  iterator __begin1;
  vector<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>,_std::allocator<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>_>_>
  *__range1;
  undefined1 local_1e0 [7];
  bool UsedTimelineSemaphore;
  string msg_10;
  string msg_9;
  string msg_8;
  string msg_7;
  undefined1 local_158 [8];
  string msg_6;
  string msg_5;
  CommandListVkImpl *pCmdListVk;
  undefined1 local_108 [4];
  Uint32 i;
  string msg_4;
  string msg_3;
  VkCommandBuffer vkCmdBuff;
  vector<Diligent::RefCntAutoPtr<Diligent::IDeviceContext>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceContext>_>_>
  DeferredCtxs;
  vector<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_> vkCmdBuffs;
  string msg_2;
  string msg_1;
  undefined1 local_40 [8];
  string msg;
  ICommandList **ppCommandLists_local;
  Uint32 NumCommandLists_local;
  DeviceContextVkImpl *this_local;
  
  msg.field_2._8_8_ = ppCommandLists;
  bVar2 = DeviceContextBase<Diligent::EngineVkImplTraits>::IsDeferred
                    ((DeviceContextBase<Diligent::EngineVkImplTraits> *)this);
  if (bVar2) {
    FormatString<char[54]>
              ((string *)local_40,
               (char (*) [54])"Flush() should only be called for immediate contexts.");
    pCVar6 = (Char *)std::__cxx11::string::c_str();
    in_RCX = (char (*) [14])0x59e;
    DebugAssertionFailed
              (pCVar6,"Flush",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x59e);
    std::__cxx11::string::~string((string *)local_40);
  }
  if (this->m_ActiveQueriesCounter != 0) {
    FormatString<char[34],int,char[94]>
              ((string *)((long)&msg_2.field_2 + 8),(Diligent *)"Flushing device context that has ",
               (char (*) [34])&this->m_ActiveQueriesCounter,
               (int *)
               " active queries. Vulkan requires that queries are begun and ended in the same command buffer."
               ,in_R8);
    pCVar6 = (Char *)std::__cxx11::string::c_str();
    in_RCX = (char (*) [14])0x5a2;
    DebugAssertionFailed
              (pCVar6,"Flush",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x5a2);
    std::__cxx11::string::~string((string *)(msg_2.field_2._M_local_buf + 8));
  }
  pRVar7 = Diligent::RefCntAutoPtr::operator_cast_to_RenderPassVkImpl_
                     ((RefCntAutoPtr *)
                      &(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                       super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pActiveRenderPass);
  if (pRVar7 != (RenderPassVkImpl *)0x0) {
    FormatString<char[54]>
              ((string *)
               &vkCmdBuffs.
                super__Vector_base<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,
               (char (*) [54])"Flushing device context inside an active render pass.");
    pCVar6 = (Char *)std::__cxx11::string::c_str();
    in_RCX = (char (*) [14])0x5a5;
    DebugAssertionFailed
              (pCVar6,"Flush",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x5a5);
    std::__cxx11::string::~string
              ((string *)
               &vkCmdBuffs.
                super__Vector_base<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  this_00 = &DeferredCtxs.
             super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IDeviceContext>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceContext>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::vector<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_>::vector
            ((vector<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_> *)this_00);
  std::
  vector<Diligent::RefCntAutoPtr<Diligent::IDeviceContext>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceContext>_>_>
  ::vector((vector<Diligent::RefCntAutoPtr<Diligent::IDeviceContext>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceContext>_>_>
            *)&vkCmdBuff);
  std::vector<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_>::reserve
            ((vector<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_> *)this_00,
             (ulong)NumCommandLists + 1);
  std::
  vector<Diligent::RefCntAutoPtr<Diligent::IDeviceContext>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceContext>_>_>
  ::reserve((vector<Diligent::RefCntAutoPtr<Diligent::IDeviceContext>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceContext>_>_>
             *)&vkCmdBuff,(ulong)NumCommandLists + 1);
  msg_3.field_2._8_8_ = VulkanUtilities::VulkanCommandBuffer::GetVkCmdBuffer(&this->m_CommandBuffer)
  ;
  if ((VkCommandBuffer)msg_3.field_2._8_8_ != (VkCommandBuffer)0x0) {
    if (this->m_pQueryMgr != (QueryManagerVk *)0x0) {
      bVar2 = DeviceContextBase<Diligent::EngineVkImplTraits>::IsDeferred
                        ((DeviceContextBase<Diligent::EngineVkImplTraits> *)this);
      if (bVar2) {
        FormatString<char[26],char[14]>
                  ((string *)((long)&msg_4.field_2 + 8),(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"!IsDeferred()",in_RCX);
        pCVar6 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar6,"Flush",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                   ,0x5b2);
        std::__cxx11::string::~string((string *)(msg_4.field_2._M_local_buf + 8));
      }
      this_01 = this->m_pQueryMgr;
      pRVar8 = RefCntAutoPtr<Diligent::RenderDeviceVkImpl>::operator->
                         (&(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                           super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pDevice);
      LogicalDevice = RenderDeviceVkImpl::GetLogicalDevice(pRVar8);
      UVar5 = QueryManagerVk::ResetStaleQueries(this_01,LogicalDevice,&this->m_CommandBuffer);
      (this->m_State).NumCommands = UVar5 + (this->m_State).NumCommands;
    }
    if ((this->m_State).NumCommands != 0) {
      EndRenderScope(this);
      if ((this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
          super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_DvpDebugGroupCount != 0) {
        FormatString<char[37]>
                  ((string *)local_108,(char (*) [37])"Not all debug groups have been ended");
        pCVar6 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar6,"Flush",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                   ,0x5bd);
        std::__cxx11::string::~string((string *)local_108);
      }
      (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
      super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_DvpDebugGroupCount = 0;
      VulkanUtilities::VulkanCommandBuffer::FlushBarriers(&this->m_CommandBuffer);
      VulkanUtilities::VulkanCommandBuffer::EndCommandBuffer(&this->m_CommandBuffer);
      std::vector<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_>::push_back
                ((vector<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_> *)
                 &DeferredCtxs.
                  super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IDeviceContext>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceContext>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (value_type *)((long)&msg_3.field_2 + 8));
    }
  }
  for (pCmdListVk._4_4_ = 0; pCmdListVk._4_4_ < NumCommandLists;
      pCmdListVk._4_4_ = pCmdListVk._4_4_ + 1) {
    this_03 = ClassPtrCast<Diligent::CommandListVkImpl,Diligent::ICommandList>
                        (*(ICommandList **)(msg.field_2._8_8_ + (ulong)pCmdListVk._4_4_ * 8));
    if (this_03 == (CommandListVkImpl *)0x0) {
      FormatString<char[30]>
                ((string *)((long)&msg_6.field_2 + 8),(char (*) [30])"Command list must not be null"
                );
      pCVar6 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar6,"Flush",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                 ,0x5cc);
      std::__cxx11::string::~string((string *)(msg_6.field_2._M_local_buf + 8));
    }
    UVar5 = CommandListBase<Diligent::EngineVkImplTraits>::GetQueueId
                      (&this_03->super_CommandListBase<Diligent::EngineVkImplTraits>);
    pDVar9 = DeviceContextBase<Diligent::EngineVkImplTraits>::GetDesc
                       ((DeviceContextBase<Diligent::EngineVkImplTraits> *)this);
    Args_1_04 = (char (*) [31])(ulong)pDVar9->QueueId;
    if (UVar5 != pDVar9->QueueId) {
      msg_7.field_2._12_4_ =
           CommandListBase<Diligent::EngineVkImplTraits>::GetQueueId
                     (&this_03->super_CommandListBase<Diligent::EngineVkImplTraits>);
      pDVar9 = DeviceContextBase<Diligent::EngineVkImplTraits>::GetDesc
                         ((DeviceContextBase<Diligent::EngineVkImplTraits> *)this);
      FormatString<char[35],unsigned_int,char[27],unsigned_char,char[2]>
                ((string *)local_158,(Diligent *)"Command list recorded for QueueId ",
                 (char (*) [35])((long)&msg_7.field_2 + 0xc),(uint *)", but executed on QueueId ",
                 (char (*) [27])&pDVar9->QueueId,".",in_stack_fffffffffffff3e8);
      pCVar6 = (Char *)std::__cxx11::string::c_str();
      Args_1_04 = (char (*) [31])0x5cd;
      DebugAssertionFailed
                (pCVar6,"Flush",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                 ,0x5cd);
      std::__cxx11::string::~string((string *)local_158);
    }
    std::
    vector<Diligent::RefCntAutoPtr<Diligent::IDeviceContext>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceContext>_>_>
    ::emplace_back<>((vector<Diligent::RefCntAutoPtr<Diligent::IDeviceContext>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceContext>_>_>
                      *)&vkCmdBuff);
    std::vector<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_>::emplace_back<>
              ((vector<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_> *)
               &DeferredCtxs.
                super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IDeviceContext>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceContext>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    pvVar10 = std::
              vector<Diligent::RefCntAutoPtr<Diligent::IDeviceContext>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceContext>_>_>
              ::back((vector<Diligent::RefCntAutoPtr<Diligent::IDeviceContext>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceContext>_>_>
                      *)&vkCmdBuff);
    ppVVar11 = std::vector<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_>::back
                         ((vector<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_> *)
                          &DeferredCtxs.
                           super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IDeviceContext>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceContext>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
    CommandListVkImpl::Close(this_03,pvVar10,ppVVar11);
    ppVVar11 = std::vector<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_>::back
                         ((vector<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_> *)
                          &DeferredCtxs.
                           super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IDeviceContext>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceContext>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (*ppVVar11 == (value_type)0x0) {
      FormatString<char[39]>
                ((string *)((long)&msg_8.field_2 + 8),
                 (char (*) [39])"Trying to execute empty command buffer");
      pCVar6 = (Char *)std::__cxx11::string::c_str();
      Args_1_04 = (char (*) [31])0x5d1;
      DebugAssertionFailed
                (pCVar6,"Flush",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                 ,0x5d1);
      std::__cxx11::string::~string((string *)(msg_8.field_2._M_local_buf + 8));
    }
    this_04 = (RefCntAutoPtr *)
              std::
              vector<Diligent::RefCntAutoPtr<Diligent::IDeviceContext>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceContext>_>_>
              ::back((vector<Diligent::RefCntAutoPtr<Diligent::IDeviceContext>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceContext>_>_>
                      *)&vkCmdBuff);
    pIVar12 = Diligent::RefCntAutoPtr::operator_cast_to_IDeviceContext_(this_04);
    if (pIVar12 == (IDeviceContext *)0x0) {
      FormatString<char[26],char[31]>
                ((string *)((long)&msg_9.field_2 + 8),(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"DeferredCtxs.back() != nullptr",Args_1_04);
      pCVar6 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar6,"Flush",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                 ,0x5d2);
      std::__cxx11::string::~string((string *)(msg_9.field_2._M_local_buf + 8));
    }
  }
  pacVar13 = (char (*) [94])
             std::vector<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>::size
                       (&this->m_VkWaitSemaphores);
  sVar14 = std::
           vector<Diligent::RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>_>_>
           ::size(&this->m_WaitManagedSemaphores);
  sVar15 = std::
           vector<VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject<VulkanUtilities::VkSemaphoreType>,_std::allocator<VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject<VulkanUtilities::VkSemaphoreType>_>_>
           ::size(&this->m_WaitRecycledSemaphores);
  if (pacVar13 != (char (*) [94])(sVar14 + sVar15)) {
    FormatString<char[26],char[94]>
              ((string *)((long)&msg_10.field_2 + 8),(Diligent *)"Debug expression failed:\n",
               (char (*) [26])
               "m_VkWaitSemaphores.size() == m_WaitManagedSemaphores.size() + m_WaitRecycledSemaphores.size()"
               ,(char (*) [94])(sVar14 + sVar15));
    pCVar6 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar6,"Flush",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x5d5);
    std::__cxx11::string::~string((string *)(msg_10.field_2._M_local_buf + 8));
  }
  pacVar16 = (char (*) [64])
             std::vector<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>::size
                       (&this->m_VkSignalSemaphores);
  Args_1 = (char (*) [64])
           std::
           vector<Diligent::RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>_>_>
           ::size(&this->m_SignalManagedSemaphores);
  if (pacVar16 != Args_1) {
    FormatString<char[26],char[64]>
              ((string *)local_1e0,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_VkSignalSemaphores.size() == m_SignalManagedSemaphores.size()",
               Args_1);
    pCVar6 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar6,"Flush",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x5d6);
    std::__cxx11::string::~string((string *)local_1e0);
  }
  bVar2 = false;
  __end1 = std::
           vector<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>,_std::allocator<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>_>_>
           ::begin(&this->m_SignalFences);
  val_fence = (pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_> *)
              std::
              vector<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>,_std::allocator<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>_>_>
              ::end(&this->m_SignalFences);
  while (bVar3 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>_*,_std::vector<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>,_std::allocator<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>_>_>_>
                                     *)&val_fence), bVar3) {
    pFenceVk = (FenceVkImpl *)
               __gnu_cxx::
               __normal_iterator<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>_*,_std::vector<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>,_std::allocator<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>_>_>_>
               ::operator*(&__end1);
    local_210 = Diligent::RefCntAutoPtr::operator_cast_to_FenceVkImpl_
                          ((RefCntAutoPtr *)
                           &(pFenceVk->super_FenceBase<Diligent::EngineVkImplTraits>).
                            super_DeviceObjectBase<Diligent::IFenceVk,_Diligent::RenderDeviceVkImpl,_Diligent::FenceDesc>
                            .super_ObjectBase<Diligent::IFenceVk>.
                            super_RefCountedObject<Diligent::IFenceVk>.m_pRefCounters);
    bVar3 = FenceVkImpl::IsTimelineSemaphore(local_210);
    if (bVar3) {
      bVar2 = true;
      FenceBase<Diligent::EngineVkImplTraits>::DvpSignal
                (&local_210->super_FenceBase<Diligent::EngineVkImplTraits>,
                 (Uint64)(pFenceVk->super_FenceBase<Diligent::EngineVkImplTraits>).
                         super_DeviceObjectBase<Diligent::IFenceVk,_Diligent::RenderDeviceVkImpl,_Diligent::FenceDesc>
                         .super_ObjectBase<Diligent::IFenceVk>.
                         super_RefCountedObject<Diligent::IFenceVk>.super_IFenceVk.super_IFence.
                         super_IDeviceObject);
      __range1_1 = (vector<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>,_std::allocator<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>_>_>
                    *)FenceVkImpl::GetVkSemaphore(local_210);
      std::vector<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>::push_back
                (&this->m_VkSignalSemaphores,(value_type *)&__range1_1);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                (&this->m_SignalSemaphoreValues,(value_type_conflict1 *)pFenceVk);
    }
    __gnu_cxx::
    __normal_iterator<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>_*,_std::vector<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>,_std::allocator<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>_>_>_>
    ::operator++(&__end1);
  }
  __end1_1 = std::
             vector<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>,_std::allocator<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>_>_>
             ::begin(&this->m_WaitFences);
  val_fence_1 = (pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_> *)
                std::
                vector<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>,_std::allocator<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>_>_>
                ::end(&this->m_WaitFences);
  while (bVar3 = __gnu_cxx::operator!=
                           (&__end1_1,
                            (__normal_iterator<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>_*,_std::vector<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>,_std::allocator<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>_>_>_>
                             *)&val_fence_1), bVar3) {
    pFenceVk_1 = (FenceVkImpl *)
                 __gnu_cxx::
                 __normal_iterator<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>_*,_std::vector<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>,_std::allocator<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>_>_>_>
                 ::operator*(&__end1_1);
    WaitSem = (VkSemaphore)
              Diligent::RefCntAutoPtr::operator_cast_to_FenceVkImpl_
                        ((RefCntAutoPtr *)
                         &(pFenceVk_1->super_FenceBase<Diligent::EngineVkImplTraits>).
                          super_DeviceObjectBase<Diligent::IFenceVk,_Diligent::RenderDeviceVkImpl,_Diligent::FenceDesc>
                          .super_ObjectBase<Diligent::IFenceVk>.
                          super_RefCountedObject<Diligent::IFenceVk>.m_pRefCounters);
    FenceBase<Diligent::EngineVkImplTraits>::DvpDeviceWait
              ((FenceBase<Diligent::EngineVkImplTraits> *)WaitSem,
               (Uint64)(pFenceVk_1->super_FenceBase<Diligent::EngineVkImplTraits>).
                       super_DeviceObjectBase<Diligent::IFenceVk,_Diligent::RenderDeviceVkImpl,_Diligent::FenceDesc>
                       .super_ObjectBase<Diligent::IFenceVk>.
                       super_RefCountedObject<Diligent::IFenceVk>.super_IFenceVk.super_IFence.
                       super_IDeviceObject);
    bVar3 = FenceVkImpl::IsTimelineSemaphore((FenceVkImpl *)WaitSem);
    this_02 = WaitSem;
    if (bVar3) {
      bVar2 = true;
      i_1 = (size_t)FenceVkImpl::GetVkSemaphore((FenceVkImpl *)WaitSem);
      for (_msg.field_2._8_8_ = 0; uVar18 = _msg.field_2._8_8_,
          sVar14 = std::vector<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>::size
                             (&this->m_VkWaitSemaphores), (ulong)uVar18 < sVar14;
          _msg.field_2._8_8_ = _msg.field_2._8_8_ + 1) {
        ppVVar17 = std::vector<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>::operator[]
                             (&this->m_VkWaitSemaphores,_msg.field_2._8_8_);
        if (*ppVVar17 == (value_type)i_1) {
          Args = DeviceObjectBase<Diligent::IFenceVk,_Diligent::RenderDeviceVkImpl,_Diligent::FenceDesc>
                 ::GetDesc((DeviceObjectBase<Diligent::IFenceVk,_Diligent::RenderDeviceVkImpl,_Diligent::FenceDesc>
                            *)WaitSem);
          Args_2 = pFenceVk_1;
          Args_4 = (char (*) [50])
                   std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             (&this->m_WaitSemaphoreValues,_msg.field_2._8_8_);
          FormatString<char[8],char_const*,char[15],unsigned_long,char[50],unsigned_long,char[2]>
                    ((string *)local_270,(Diligent *)0xe674f3,(char (*) [8])Args,
                     (char **)"\' with value (",(char (*) [15])Args_2,
                     (unsigned_long *)") is already added to wait operation with value (",Args_4,
                     (unsigned_long *)0xf65f2d,in_stack_fffffffffffff3f8);
          puVar1 = DebugMessageCallback;
          if (DebugMessageCallback != (undefined *)0x0) {
            uVar18 = std::__cxx11::string::c_str();
            (*(code *)puVar1)(2,uVar18,0);
          }
          std::__cxx11::string::~string((string *)local_270);
        }
      }
      std::vector<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>::push_back
                (&this->m_VkWaitSemaphores,(value_type *)&i_1);
      WaitSem_1._28_4_ = 0x10000;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (&this->m_WaitDstStageMasks,(value_type_conflict *)&WaitSem_1.field_0x1c);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                (&this->m_WaitSemaphoreValues,(value_type_conflict1 *)pFenceVk_1);
    }
    else {
      local_299 = (uchar)DeviceContextNextGenBase<Diligent::EngineVkImplTraits>::GetCommandQueueId
                                   (&this->
                                     super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>);
      FenceVkImpl::ExtractSignalSemaphore
                ((VulkanRecycledSemaphore *)local_298,(FenceVkImpl *)this_02,
                 (SoftwareQueueIndex)local_299,
                 (Uint64)(pFenceVk_1->super_FenceBase<Diligent::EngineVkImplTraits>).
                         super_DeviceObjectBase<Diligent::IFenceVk,_Diligent::RenderDeviceVkImpl,_Diligent::FenceDesc>
                         .super_ObjectBase<Diligent::IFenceVk>.
                         super_RefCountedObject<Diligent::IFenceVk>.super_IFenceVk.super_IFence.
                         super_IDeviceObject);
      bVar3 = VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject::operator_cast_to_bool
                        ((RecycledSyncObject *)local_298);
      if (bVar3) {
        local_2a8 = VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject::
                    operator_cast_to_VkSemaphore_T_((RecycledSyncObject *)local_298);
        std::vector<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>::push_back
                  (&this->m_VkWaitSemaphores,&local_2a8);
        local_2ac = 0x10000;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  (&this->m_WaitDstStageMasks,&local_2ac);
        std::
        vector<VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject<VulkanUtilities::VkSemaphoreType>,_std::allocator<VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject<VulkanUtilities::VkSemaphoreType>_>_>
        ::push_back(&this->m_WaitRecycledSemaphores,(value_type *)local_298);
        msg_11.field_2._8_8_ = 0;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  (&this->m_WaitSemaphoreValues,
                   (value_type_conflict1 *)(msg_11.field_2._M_local_buf + 8));
      }
      VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject<VulkanUtilities::VkSemaphoreType>
      ::~RecycledSyncObject((RecycledSyncObject<VulkanUtilities::VkSemaphoreType> *)local_298);
    }
    __gnu_cxx::
    __normal_iterator<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>_*,_std::vector<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>,_std::allocator<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>_>_>_>
    ::operator++(&__end1_1);
  }
  pacVar19 = (char (*) [56])
             std::vector<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>::size
                       (&this->m_VkWaitSemaphores);
  Args_1_00 = (char (*) [56])
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                        (&this->m_WaitDstStageMasks);
  if (pacVar19 != Args_1_00) {
    FormatString<char[26],char[56]>
              ((string *)((long)&msg_12.field_2 + 8),(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_VkWaitSemaphores.size() == m_WaitDstStageMasks.size()",Args_1_00);
    pCVar6 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar6,"Flush",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x608);
    std::__cxx11::string::~string((string *)(msg_12.field_2._M_local_buf + 8));
  }
  pacVar20 = (char (*) [58])
             std::vector<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>::size
                       (&this->m_VkWaitSemaphores);
  Args_1_01 = (char (*) [58])
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                        (&this->m_WaitSemaphoreValues);
  if (pacVar20 != Args_1_01) {
    FormatString<char[26],char[58]>
              ((string *)((long)&msg_13.field_2 + 8),(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_VkWaitSemaphores.size() == m_WaitSemaphoreValues.size()",Args_1_01)
    ;
    pCVar6 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar6,"Flush",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x609);
    std::__cxx11::string::~string((string *)(msg_13.field_2._M_local_buf + 8));
  }
  pacVar21 = (char (*) [62])
             std::vector<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>::size
                       (&this->m_VkSignalSemaphores);
  Args_1_02 = (char (*) [62])
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                        (&this->m_SignalSemaphoreValues);
  if (pacVar21 != Args_1_02) {
    FormatString<char[26],char[62]>
              ((string *)&SubmitInfo.pSignalSemaphores,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_VkSignalSemaphores.size() == m_SignalSemaphoreValues.size()",
               Args_1_02);
    pCVar6 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar6,"Flush",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x60a);
    std::__cxx11::string::~string((string *)&SubmitInfo.pSignalSemaphores);
  }
  memset(&TimelineSemaphoreSubmitInfo.pSignalSemaphoreValues,0,0x48);
  TimelineSemaphoreSubmitInfo.pSignalSemaphoreValues._0_4_ = 4;
  SubmitInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  SubmitInfo._4_4_ = 0;
  sVar14 = std::vector<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_>::size
                     ((vector<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_> *)
                      &DeferredCtxs.
                       super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IDeviceContext>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceContext>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
  SubmitInfo.pWaitDstStageMask._0_4_ = (undefined4)sVar14;
  SubmitInfo._40_8_ =
       std::vector<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_>::data
                 ((vector<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_> *)
                  &DeferredCtxs.
                   super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IDeviceContext>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceContext>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
  sVar14 = std::vector<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>::size
                     (&this->m_VkWaitSemaphores);
  SubmitInfo.pNext._0_4_ = (int)sVar14;
  if ((int)SubmitInfo.pNext == 0) {
    local_b48 = (VkSemaphore_T **)0x0;
  }
  else {
    local_b48 = std::vector<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>::data
                          (&this->m_VkWaitSemaphores);
  }
  SubmitInfo._16_8_ = local_b48;
  if ((int)SubmitInfo.pNext == 0) {
    local_b50 = (VkSemaphore *)0x0;
  }
  else {
    local_b50 = (VkSemaphore *)
                std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data
                          (&this->m_WaitDstStageMasks);
  }
  SubmitInfo.pWaitSemaphores = local_b50;
  sVar14 = std::vector<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>::size
                     (&this->m_VkSignalSemaphores);
  SubmitInfo.pCommandBuffers._0_4_ = (int)sVar14;
  if ((int)SubmitInfo.pCommandBuffers == 0) {
    local_b58 = (VkSemaphore_T **)0x0;
  }
  else {
    local_b58 = std::vector<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>::data
                          (&this->m_VkSignalSemaphores);
  }
  SubmitInfo._56_8_ = local_b58;
  memset(&SubmittedFenceValue,0,0x30);
  if (bVar2) {
    SubmitInfo._0_8_ = &SubmittedFenceValue;
    SubmittedFenceValue._0_4_ = 0x3b9df29b;
    TimelineSemaphoreSubmitInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    TimelineSemaphoreSubmitInfo._4_4_ = 0;
    TimelineSemaphoreSubmitInfo.pNext._0_4_ = (int)SubmitInfo.pNext;
    if ((int)SubmitInfo.pNext == 0) {
      local_b60 = (unsigned_long *)0x0;
    }
    else {
      local_b60 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                            (&this->m_WaitSemaphoreValues);
    }
    TimelineSemaphoreSubmitInfo._16_8_ = local_b60;
    TimelineSemaphoreSubmitInfo.pWaitSemaphoreValues._0_4_ = (int)SubmitInfo.pCommandBuffers;
    if ((int)SubmitInfo.pCommandBuffers == 0) {
      local_b68 = (unsigned_long *)0x0;
    }
    else {
      local_b68 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                            (&this->m_SignalSemaphoreValues);
    }
    TimelineSemaphoreSubmitInfo._32_8_ = local_b68;
  }
  pRVar8 = RefCntAutoPtr<Diligent::RenderDeviceVkImpl>::operator->
                     (&(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                       super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pDevice);
  SVar4 = DeviceContextNextGenBase<Diligent::EngineVkImplTraits>::GetCommandQueueId
                    (&this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>);
  FenceValue = RenderDeviceVkImpl::ExecuteCommandBuffer
                         (pRVar8,SVar4,
                          (VkSubmitInfo *)&TimelineSemaphoreSubmitInfo.pSignalSemaphoreValues,
                          &this->m_SignalFences);
  pRVar8 = RefCntAutoPtr<Diligent::RenderDeviceVkImpl>::operator->
                     (&(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                       super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pDevice);
  SVar4 = DeviceContextNextGenBase<Diligent::EngineVkImplTraits>::GetCommandQueueId
                    (&this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>);
  this_05 = RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
            ::GetReleaseQueue(&pRVar8->
                               super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
                              ,SVar4);
  Args_1_05 = this_05;
  __end2 = std::
           vector<VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject<VulkanUtilities::VkSemaphoreType>,_std::allocator<VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject<VulkanUtilities::VkSemaphoreType>_>_>
           ::begin(&this->m_WaitRecycledSemaphores);
  Sem = (RecycledSyncObject<VulkanUtilities::VkSemaphoreType> *)
        std::
        vector<VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject<VulkanUtilities::VkSemaphoreType>,_std::allocator<VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject<VulkanUtilities::VkSemaphoreType>_>_>
        ::end(&this->m_WaitRecycledSemaphores);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject<VulkanUtilities::VkSemaphoreType>_*,_std::vector<VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject<VulkanUtilities::VkSemaphoreType>,_std::allocator<VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject<VulkanUtilities::VkSemaphoreType>_>_>_>
                                     *)&Sem), bVar2) {
    this_06 = __gnu_cxx::
              __normal_iterator<VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject<VulkanUtilities::VkSemaphoreType>_*,_std::vector<VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject<VulkanUtilities::VkSemaphoreType>,_std::allocator<VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject<VulkanUtilities::VkSemaphoreType>_>_>_>
              ::operator*(&__end2);
    VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject<VulkanUtilities::VkSemaphoreType>::
    SetUnsignaled(this_06);
    ResourceReleaseQueue<Diligent::DynamicStaleResourceWrapper>::
    DiscardResource<VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject<VulkanUtilities::VkSemaphoreType>,void>
              (this_05,this_06,FenceValue);
    __gnu_cxx::
    __normal_iterator<VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject<VulkanUtilities::VkSemaphoreType>_*,_std::vector<VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject<VulkanUtilities::VkSemaphoreType>,_std::allocator<VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject<VulkanUtilities::VkSemaphoreType>_>_>_>
    ::operator++(&__end2);
  }
  std::
  vector<VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject<VulkanUtilities::VkSemaphoreType>,_std::allocator<VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject<VulkanUtilities::VkSemaphoreType>_>_>
  ::clear(&this->m_WaitRecycledSemaphores);
  std::
  vector<Diligent::RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>_>_>
  ::clear(&this->m_WaitManagedSemaphores);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear(&this->m_WaitDstStageMasks);
  std::
  vector<Diligent::RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>_>_>
  ::clear(&this->m_SignalManagedSemaphores);
  std::vector<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>::clear(&this->m_VkWaitSemaphores);
  std::vector<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>::clear(&this->m_VkSignalSemaphores)
  ;
  std::
  vector<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>,_std::allocator<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>_>_>
  ::clear(&this->m_SignalFences);
  std::
  vector<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>,_std::allocator<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>_>_>
  ::clear(&this->m_WaitFences);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::clear(&this->m_WaitSemaphoreValues);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::clear(&this->m_SignalSemaphoreValues);
  msg_14.field_2._8_8_ = 0;
  if (msg_3.field_2._8_8_ != 0) {
    ppVVar11 = std::vector<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_>::operator[]
                         ((vector<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_> *)
                          &DeferredCtxs.
                           super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IDeviceContext>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceContext>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
    if (*ppVVar11 != (value_type)msg_3.field_2._8_8_) {
      FormatString<char[26],char[34]>
                ((string *)&i_2,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"vkCmdBuffs[buff_idx] == vkCmdBuff",(char (*) [34])Args_1_05);
      pCVar6 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar6,"Flush",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                 ,0x63f);
      std::__cxx11::string::~string((string *)&i_2);
    }
    SVar4 = DeviceContextNextGenBase<Diligent::EngineVkImplTraits>::GetCommandQueueId
                      (&this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>);
    DisposeCurrentCmdBuffer(this,SVar4,FenceValue);
    msg_14.field_2._8_8_ = msg_14.field_2._8_8_ + 1;
  }
  for (pDeferredCtxVkImpl._0_4_ = 0; uVar18 = msg_14.field_2._8_8_,
      (uint)pDeferredCtxVkImpl < NumCommandLists;
      pDeferredCtxVkImpl._0_4_ = (uint)pDeferredCtxVkImpl + 1) {
    pvVar10 = std::
              vector<Diligent::RefCntAutoPtr<Diligent::IDeviceContext>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceContext>_>_>
              ::operator[]((vector<Diligent::RefCntAutoPtr<Diligent::IDeviceContext>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceContext>_>_>
                            *)&vkCmdBuff,(ulong)(uint)pDeferredCtxVkImpl);
    this_07 = RefCntAutoPtr<Diligent::IDeviceContext>::RawPtr<Diligent::DeviceContextVkImpl>
                        (pvVar10);
    msg_15.field_2._M_local_buf[0xf] =
         (char)DeviceContextNextGenBase<Diligent::EngineVkImplTraits>::GetCommandQueueId
                         (&this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>);
    UVar5 = IndexWrapper::operator_cast_to_unsigned_int
                      ((IndexWrapper *)(msg_15.field_2._M_local_buf + 0xf));
    DeviceContextNextGenBase<Diligent::EngineVkImplTraits>::UpdateSubmittedBuffersCmdQueueMask
              (&this_07->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>,UVar5);
    msg_15.field_2._M_local_buf[0xe] =
         (char)DeviceContextNextGenBase<Diligent::EngineVkImplTraits>::GetCommandQueueId
                         (&this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>);
    ppVVar11 = std::vector<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_>::operator[]
                         ((vector<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_> *)
                          &DeferredCtxs.
                           super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IDeviceContext>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceContext>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,msg_14.field_2._8_8_);
    DisposeVkCmdBuffer(this_07,(SoftwareQueueIndex)msg_15.field_2._M_local_buf[0xe],*ppVVar11,
                       FenceValue);
    msg_14.field_2._8_8_ = msg_14.field_2._8_8_ + 1;
  }
  Args_1_03 = (char (*) [30])
              std::vector<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_>::size
                        ((vector<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_> *)
                         &DeferredCtxs.
                          super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IDeviceContext>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceContext>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if ((char (*) [30])uVar18 != Args_1_03) {
    FormatString<char[26],char[30]>
              ((string *)local_430,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"buff_idx == vkCmdBuffs.size()",Args_1_03);
    pCVar6 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar6,"Flush",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x64d);
    std::__cxx11::string::~string((string *)local_430);
  }
  auStack_440[4] = 0;
  auStack_440[5] = 0;
  auStack_440[6] = 0;
  auStack_440[7] = 0;
  auStack_440._8_4_ = 0;
  auStack_440._12_4_ = 0x7fffffff;
  (this->m_State).CommittedVBsUpToDate = false;
  (this->m_State).CommittedIBUpToDate = false;
  (this->m_State).ShadingRateIsSet = false;
  (this->m_State).NullRenderTargets = false;
  (this->m_State).NumCommands = 0;
  (this->m_State).vkPipelineBindPoint = VK_PIPELINE_BIND_POINT_MAX_ENUM;
  local_bc8 = local_a10._M_elems;
  do {
    ResourceBindInfo::ResourceBindInfo(local_bc8);
    local_bc8 = local_bc8 + 1;
  } while (local_bc8 != (ResourceBindInfo *)auStack_440);
  std::array<Diligent::DeviceContextVkImpl::ResourceBindInfo,_3UL>::operator=
            (&this->m_BindInfo,&local_a10);
  std::array<Diligent::DeviceContextVkImpl::ResourceBindInfo,_3UL>::~array(&local_a10);
  VulkanUtilities::VulkanCommandBuffer::Reset(&this->m_CommandBuffer);
  RefCntAutoPtr<Diligent::PipelineStateVkImpl>::operator=
            (&(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
              super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pPipelineState,
             (PipelineStateVkImpl *)0x0);
  RefCntAutoPtr<Diligent::RenderPassVkImpl>::operator=
            (&(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
              super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pActiveRenderPass,
             (RenderPassVkImpl *)0x0);
  RefCntAutoPtr<Diligent::FramebufferVkImpl>::operator=
            (&(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
              super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pBoundFramebuffer,
             (FramebufferVkImpl *)0x0);
  std::
  vector<Diligent::RefCntAutoPtr<Diligent::IDeviceContext>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceContext>_>_>
  ::~vector((vector<Diligent::RefCntAutoPtr<Diligent::IDeviceContext>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceContext>_>_>
             *)&vkCmdBuff);
  std::vector<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_>::~vector
            ((vector<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_> *)
             &DeferredCtxs.
              super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IDeviceContext>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceContext>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void DeviceContextVkImpl::Flush(Uint32               NumCommandLists,
                                ICommandList* const* ppCommandLists)
{
    DEV_CHECK_ERR(!IsDeferred(), "Flush() should only be called for immediate contexts.");

    DEV_CHECK_ERR(m_ActiveQueriesCounter == 0,
                  "Flushing device context that has ", m_ActiveQueriesCounter,
                  " active queries. Vulkan requires that queries are begun and ended in the same command buffer.");

    DEV_CHECK_ERR(m_pActiveRenderPass == nullptr,
                  "Flushing device context inside an active render pass.");

    // TODO: replace with small_vector
    std::vector<VkCommandBuffer>               vkCmdBuffs;
    std::vector<RefCntAutoPtr<IDeviceContext>> DeferredCtxs;
    vkCmdBuffs.reserve(size_t{NumCommandLists} + 1);
    DeferredCtxs.reserve(size_t{NumCommandLists} + 1);

    VkCommandBuffer vkCmdBuff = m_CommandBuffer.GetVkCmdBuffer();
    if (vkCmdBuff != VK_NULL_HANDLE)
    {
        if (m_pQueryMgr != nullptr)
        {
            VERIFY_EXPR(!IsDeferred());
            // Note that vkCmdResetQueryPool must be called outside of a render pass,
            // so it is better to reset all queries at once at the end of the command buffer.
            m_State.NumCommands += m_pQueryMgr->ResetStaleQueries(m_pDevice->GetLogicalDevice(), m_CommandBuffer);
        }

        if (m_State.NumCommands != 0)
        {
            EndRenderScope();

#ifdef DILIGENT_DEVELOPMENT
            DEV_CHECK_ERR(m_DvpDebugGroupCount == 0, "Not all debug groups have been ended");
            m_DvpDebugGroupCount = 0;
#endif

            m_CommandBuffer.FlushBarriers();
            m_CommandBuffer.EndCommandBuffer();

            vkCmdBuffs.push_back(vkCmdBuff);
        }
    }

    // Add command buffers from deferred contexts
    for (Uint32 i = 0; i < NumCommandLists; ++i)
    {
        CommandListVkImpl* pCmdListVk = ClassPtrCast<CommandListVkImpl>(ppCommandLists[i]);
        DEV_CHECK_ERR(pCmdListVk != nullptr, "Command list must not be null");
        DEV_CHECK_ERR(pCmdListVk->GetQueueId() == GetDesc().QueueId, "Command list recorded for QueueId ", pCmdListVk->GetQueueId(), ", but executed on QueueId ", GetDesc().QueueId, ".");
        DeferredCtxs.emplace_back();
        vkCmdBuffs.emplace_back();
        pCmdListVk->Close(DeferredCtxs.back(), vkCmdBuffs.back());
        VERIFY(vkCmdBuffs.back() != VK_NULL_HANDLE, "Trying to execute empty command buffer");
        VERIFY_EXPR(DeferredCtxs.back() != nullptr);
    }

    VERIFY_EXPR(m_VkWaitSemaphores.size() == m_WaitManagedSemaphores.size() + m_WaitRecycledSemaphores.size());
    VERIFY_EXPR(m_VkSignalSemaphores.size() == m_SignalManagedSemaphores.size());

    bool UsedTimelineSemaphore = false;
    for (auto& val_fence : m_SignalFences)
    {
        FenceVkImpl* pFenceVk = val_fence.second;
        if (!pFenceVk->IsTimelineSemaphore())
            continue;
        UsedTimelineSemaphore = true;
        pFenceVk->DvpSignal(val_fence.first);
        m_VkSignalSemaphores.push_back(pFenceVk->GetVkSemaphore());
        m_SignalSemaphoreValues.push_back(val_fence.first);
    }

    for (auto& val_fence : m_WaitFences)
    {
        FenceVkImpl* pFenceVk = val_fence.second;
        pFenceVk->DvpDeviceWait(val_fence.first);

        if (pFenceVk->IsTimelineSemaphore())
        {
            UsedTimelineSemaphore = true;
            VkSemaphore WaitSem   = pFenceVk->GetVkSemaphore();
#ifdef DILIGENT_DEVELOPMENT
            for (size_t i = 0; i < m_VkWaitSemaphores.size(); ++i)
            {
                if (m_VkWaitSemaphores[i] == WaitSem)
                {
                    LOG_ERROR_MESSAGE("Fence '", pFenceVk->GetDesc().Name, "' with value (", val_fence.first,
                                      ") is already added to wait operation with value (", m_WaitSemaphoreValues[i], ")");
                }
            }
#endif
            m_VkWaitSemaphores.push_back(WaitSem);
            m_WaitDstStageMasks.push_back(VK_PIPELINE_STAGE_ALL_COMMANDS_BIT);
            m_WaitSemaphoreValues.push_back(val_fence.first);
        }
        else
        {
            if (VulkanUtilities::VulkanRecycledSemaphore WaitSem = pFenceVk->ExtractSignalSemaphore(GetCommandQueueId(), val_fence.first))
            {
                // Here we have unique binary semaphore that must be released/recycled using release queue
                m_VkWaitSemaphores.push_back(WaitSem);
                m_WaitDstStageMasks.push_back(VK_PIPELINE_STAGE_ALL_COMMANDS_BIT);
                m_WaitRecycledSemaphores.push_back(std::move(WaitSem));
                m_WaitSemaphoreValues.push_back(0); // Ignored for binary semaphore
            }
        }
    }

    VERIFY_EXPR(m_VkWaitSemaphores.size() == m_WaitDstStageMasks.size());
    VERIFY_EXPR(m_VkWaitSemaphores.size() == m_WaitSemaphoreValues.size());
    VERIFY_EXPR(m_VkSignalSemaphores.size() == m_SignalSemaphoreValues.size());

    VkSubmitInfo SubmitInfo{};
    SubmitInfo.sType                = VK_STRUCTURE_TYPE_SUBMIT_INFO;
    SubmitInfo.pNext                = nullptr;
    SubmitInfo.commandBufferCount   = static_cast<uint32_t>(vkCmdBuffs.size());
    SubmitInfo.pCommandBuffers      = vkCmdBuffs.data();
    SubmitInfo.waitSemaphoreCount   = static_cast<uint32_t>(m_VkWaitSemaphores.size());
    SubmitInfo.pWaitSemaphores      = SubmitInfo.waitSemaphoreCount != 0 ? m_VkWaitSemaphores.data() : nullptr;
    SubmitInfo.pWaitDstStageMask    = SubmitInfo.waitSemaphoreCount != 0 ? m_WaitDstStageMasks.data() : nullptr;
    SubmitInfo.signalSemaphoreCount = static_cast<uint32_t>(m_VkSignalSemaphores.size());
    SubmitInfo.pSignalSemaphores    = SubmitInfo.signalSemaphoreCount != 0 ? m_VkSignalSemaphores.data() : nullptr;

    VkTimelineSemaphoreSubmitInfo TimelineSemaphoreSubmitInfo{};
    if (UsedTimelineSemaphore)
    {
        SubmitInfo.pNext = &TimelineSemaphoreSubmitInfo;

        TimelineSemaphoreSubmitInfo.sType                     = VK_STRUCTURE_TYPE_TIMELINE_SEMAPHORE_SUBMIT_INFO;
        TimelineSemaphoreSubmitInfo.pNext                     = nullptr;
        TimelineSemaphoreSubmitInfo.waitSemaphoreValueCount   = SubmitInfo.waitSemaphoreCount;
        TimelineSemaphoreSubmitInfo.pWaitSemaphoreValues      = SubmitInfo.waitSemaphoreCount ? m_WaitSemaphoreValues.data() : nullptr;
        TimelineSemaphoreSubmitInfo.signalSemaphoreValueCount = SubmitInfo.signalSemaphoreCount;
        TimelineSemaphoreSubmitInfo.pSignalSemaphoreValues    = SubmitInfo.signalSemaphoreCount ? m_SignalSemaphoreValues.data() : nullptr;
    }

    // Submit command buffer even if there are no commands to release stale resources.
    Uint64 SubmittedFenceValue = m_pDevice->ExecuteCommandBuffer(GetCommandQueueId(), SubmitInfo, &m_SignalFences);

    // Recycle semaphores
    {
        auto& ReleaseQueue = m_pDevice->GetReleaseQueue(GetCommandQueueId());
        for (auto& Sem : m_WaitRecycledSemaphores)
        {
            Sem.SetUnsignaled();
            ReleaseQueue.DiscardResource(std::move(Sem), SubmittedFenceValue);
        }
        m_WaitRecycledSemaphores.clear();
    }

    m_WaitManagedSemaphores.clear();
    m_WaitDstStageMasks.clear();
    m_SignalManagedSemaphores.clear();
    m_VkWaitSemaphores.clear();
    m_VkSignalSemaphores.clear();
    m_SignalFences.clear();
    m_WaitFences.clear();
    m_WaitSemaphoreValues.clear();
    m_SignalSemaphoreValues.clear();

    size_t buff_idx = 0;
    if (vkCmdBuff != VK_NULL_HANDLE)
    {
        VERIFY_EXPR(vkCmdBuffs[buff_idx] == vkCmdBuff);
        DisposeCurrentCmdBuffer(GetCommandQueueId(), SubmittedFenceValue);
        ++buff_idx;
    }

    for (Uint32 i = 0; i < NumCommandLists; ++i, ++buff_idx)
    {
        DeviceContextVkImpl* pDeferredCtxVkImpl = DeferredCtxs[i].RawPtr<DeviceContextVkImpl>();
        // Set the bit in the deferred context cmd queue mask corresponding to cmd queue of this context
        pDeferredCtxVkImpl->UpdateSubmittedBuffersCmdQueueMask(GetCommandQueueId());
        // It is OK to dispose command buffer from another thread. We are not going to
        // record any commands and only need to add the buffer to the queue
        pDeferredCtxVkImpl->DisposeVkCmdBuffer(GetCommandQueueId(), std::move(vkCmdBuffs[buff_idx]), SubmittedFenceValue);
    }
    VERIFY_EXPR(buff_idx == vkCmdBuffs.size());

    m_State    = {};
    m_BindInfo = {};
    m_CommandBuffer.Reset();
    m_pPipelineState    = nullptr;
    m_pActiveRenderPass = nullptr;
    m_pBoundFramebuffer = nullptr;
}